

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.c
# Opt level: O3

int inform_bin_bounds(double *series,size_t n,double *bounds,size_t m,int *binned,inform_error *err)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  size_t sVar5;
  
  uVar4 = (uint)m;
  if (series != (double *)0x0) {
    if (n == 0) {
      if (err == (inform_error *)0x0) {
        return 0;
      }
      *err = INFORM_ESHORTSERIES;
      return 0;
    }
    if (bounds == (double *)0x0 || m == 0) {
      if (err == (inform_error *)0x0) {
        return 0;
      }
      *err = INFORM_EBIN;
      return 0;
    }
    if (binned != (int *)0x0) {
      sVar5 = 0;
      iVar2 = 0;
      do {
        binned[sVar5] = uVar4;
        uVar3 = m & 0xffffffff;
        if (0 < (int)uVar4) {
          uVar3 = 0;
          do {
            if (series[sVar5] < bounds[uVar3]) {
              binned[sVar5] = (int)uVar3;
              goto LAB_00108e10;
            }
            uVar3 = uVar3 + 1;
          } while ((uVar4 & 0x7fffffff) != uVar3);
          uVar3 = m & 0xffffffff;
        }
LAB_00108e10:
        iVar1 = (int)uVar3;
        if ((int)uVar3 < iVar2) {
          iVar1 = iVar2;
        }
        iVar2 = iVar1;
        sVar5 = sVar5 + 1;
        if (sVar5 == n) {
          return iVar2 + 1;
        }
      } while( true );
    }
  }
  if (err == (inform_error *)0x0) {
    return 0;
  }
  *err = INFORM_ETIMESERIES;
  return 0;
}

Assistant:

int inform_bin_bounds(double const *series, size_t n, double const *bounds,
    size_t m, int *binned, inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0);
    else if (bounds == NULL || m == 0)
        INFORM_ERROR_RETURN(err, INFORM_EBIN, 0);
    else if (binned == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);

    int b = 0;
    for (size_t i = 0; i < n; ++i)
    {
        binned[i] = (int)m;
        for (int x = 0; x < (int)m; ++x)
        {
            if (series[i] < bounds[x])
            {
                binned[i] = x;
                break;
            }
        }
        b = (b < binned[i]) ? binned[i] : b;
    }

    return b + 1;
}